

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

char * golf_file_copy_line(char *string,char **line_buffer,int *line_buffer_len)

{
  bool bVar1;
  int local_2c;
  int i;
  int *line_buffer_len_local;
  char **line_buffer_local;
  char *string_local;
  
  if ((string == (char *)0x0) || (*string == '\0')) {
    string_local = (char *)0x0;
  }
  else {
    local_2c = 0;
    while( true ) {
      bVar1 = false;
      if (string[local_2c] != '\n') {
        bVar1 = string[local_2c] != '\0';
      }
      if (!bVar1) break;
      if (local_2c == *line_buffer_len) {
        _grow_buffer(line_buffer,line_buffer_len);
      }
      (*line_buffer)[local_2c] = string[local_2c];
      local_2c = local_2c + 1;
    }
    if ((0 < local_2c) && ((*line_buffer)[local_2c + -1] == '\r')) {
      (*line_buffer)[local_2c + -1] = '\0';
    }
    if (local_2c == *line_buffer_len) {
      _grow_buffer(line_buffer,line_buffer_len);
    }
    (*line_buffer)[local_2c] = '\0';
    string_local = string + local_2c;
  }
  return string_local;
}

Assistant:

const char *golf_file_copy_line(const char *string, char **line_buffer, int *line_buffer_len) {
    if (!string || !string[0]) {
        return NULL;
    }

    int i = 0;
    while (string[i] != '\n' && string[i]) {
        if (i == *line_buffer_len) {
            _grow_buffer(line_buffer, line_buffer_len);
        }
        (*line_buffer)[i] = string[i];
        i++;
    }
    if (i > 0 && (*line_buffer)[i - 1] == '\r') {
        (*line_buffer)[i - 1] = 0;
    }

    // Allocate room for the null character if needed.
    if (i == *line_buffer_len) {
        _grow_buffer(line_buffer, line_buffer_len);
    }
    (*line_buffer)[i] = 0;

    return string + i;
}